

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

void __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::add_to_nonfull(basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 *this,db_leaf_unique_ptr *child,tree_depth_type depth,uint8_t children_count_)

{
  key_union *pkVar1;
  byte *pbVar2;
  byte key_byte;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *pbVar3;
  in_critical_section<std::byte> *piVar4;
  in_critical_section<std::byte> *piVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  key_union *pkVar9;
  ulong uVar10;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar11;
  key_union *pkVar12;
  ulong uVar13;
  undefined1 *puVar14;
  
  if ((this->
      super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      ).
      super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      .children_count.value.super___atomic_base<unsigned_char>._M_i != children_count_) {
    __assert_fail("children_count_ == this->children_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x725,
                  "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (0xf < children_count_) {
    __assert_fail("children_count_ < parent_class::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x726,
                  "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pkVar1 = &this->keys;
  uVar13 = (ulong)children_count_;
  puVar14 = (undefined1 *)((long)((this->children)._M_elems + -2) + uVar13);
  pkVar9 = pkVar1;
  pkVar12 = pkVar1;
  uVar8 = uVar13;
  if (children_count_ != '\0') {
    do {
      if (uVar8 - 1 == 0) goto LAB_00150a01;
      pkVar9 = (key_union *)((long)pkVar12 + 1);
      piVar4 = (pkVar12->byte_array)._M_elems;
      piVar5 = (pkVar12->byte_array)._M_elems;
      pkVar12 = pkVar9;
      uVar8 = uVar8 - 1;
    } while ((piVar5->value)._M_i <= piVar4[1].value._M_i);
  }
  if (pkVar9 != (key_union *)puVar14) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x728,
                  "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
LAB_00150a01:
  key_byte = ((child->_M_t).
              super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              .
              super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
             ._M_head_impl)->data[depth.value];
  bVar7 = get_sorted_key_array_insert_position(this,key_byte);
  if (bVar7 != children_count_) {
    if (children_count_ <= bVar7) {
      __assert_fail("insert_pos_index < children_count_",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x730,
                    "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                   );
    }
    uVar8 = (ulong)bVar7;
    if (*(byte *)((long)pkVar1 + uVar8) == key_byte) {
      __assert_fail("keys.byte_array[insert_pos_index] != key_byte",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x731,
                    "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                   );
    }
    if (puVar14 != (undefined1 *)((long)pkVar1 + uVar8) &&
        -1 < (long)puVar14 - (long)((long)pkVar1 + uVar8)) {
      uVar10 = (uVar13 - uVar8) + 1;
      do {
        *puVar14 = puVar14[-1];
        puVar14 = puVar14 + -1;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    if (uVar8 < uVar13) {
      piVar11 = (this->children)._M_elems + uVar13;
      uVar8 = (uVar13 - uVar8) + 1;
      do {
        (piVar11->value)._M_i.tagged_ptr = *(uintptr_t *)(piVar11 + -1);
        piVar11 = piVar11 + -1;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
  }
  *(byte *)((long)pkVar1 + (ulong)bVar7) = key_byte;
  pbVar3 = (child->_M_t).
           super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           .
           super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
           ._M_head_impl;
  (child->_M_t).
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl =
       (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
        *)0x0;
  if (((ulong)pbVar3 & 7) != 0) {
    __assert_fail("(result & ptr_bit_mask) == uintptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                  ,0x182,
                  "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                 );
  }
  (this->children)._M_elems[bVar7].value._M_i.tagged_ptr = (uintptr_t)pbVar3;
  (this->
  super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ).
  super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  .children_count.value.super___atomic_base<unsigned_char>._M_i = children_count_ + '\x01';
  uVar8 = 0;
  do {
    if (uVar13 == uVar8) {
      return;
    }
    lVar6 = uVar8 - 0xf;
    pbVar2 = (byte *)((long)((this->children)._M_elems + -2) + uVar8);
    uVar8 = uVar8 + 1;
  } while (*pbVar2 <= *(byte *)((long)(this->children)._M_elems + lVar6));
  __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x741,
                "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void add_to_nonfull(db_leaf_unique_ptr &&child,
                                tree_depth_type depth,
                                std::uint8_t children_count_) noexcept {
    UNODB_DETAIL_ASSERT(children_count_ == this->children_count);
    UNODB_DETAIL_ASSERT(children_count_ < parent_class::capacity);
    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));

    const auto key_byte = child->get_key_view()[depth];

    const auto insert_pos_index =
        get_sorted_key_array_insert_position(key_byte);

    if (insert_pos_index != children_count_) {
      UNODB_DETAIL_ASSERT(insert_pos_index < children_count_);
      UNODB_DETAIL_ASSERT(keys.byte_array[insert_pos_index] != key_byte);

      std::copy_backward(keys.byte_array.cbegin() + insert_pos_index,
                         keys.byte_array.cbegin() + children_count_,
                         keys.byte_array.begin() + children_count_ + 1);
      std::copy_backward(children.begin() + insert_pos_index,
                         children.begin() + children_count_,
                         children.begin() + children_count_ + 1);
    }

    keys.byte_array[insert_pos_index] = key_byte;
    children[insert_pos_index] = node_ptr{child.release(), node_type::LEAF};
    ++children_count_;
    this->children_count = children_count_;

    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));
  }